

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

natwm_error
string_get_delimiter(char *string,char delimiter,char **destination,size_t *length,_Bool consume)

{
  natwm_error nVar1;
  size_t local_38;
  size_t index;
  
  local_38 = 0;
  nVar1 = string_find_char(string,delimiter,&local_38);
  if (nVar1 == NO_ERROR) {
    if (consume) {
      local_38 = local_38 + 1;
    }
    nVar1 = string_splice(string,0,local_38,destination,length);
  }
  return nVar1;
}

Assistant:

enum natwm_error string_get_delimiter(const char *string, char delimiter, char **destination,
                                      size_t *length, bool consume)
{
        size_t index = 0;
        enum natwm_error find_err = string_find_char(string, delimiter, &index);

        if (find_err != NO_ERROR) {
                return find_err;
        }

        if (consume) {
                ++index;
        }

        enum natwm_error splice_err = string_splice(string, 0, index, destination, length);

        if (splice_err != NO_ERROR) {
                return splice_err;
        }

        return NO_ERROR;
}